

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_insert_success_endIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x10e970;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(local_20,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '\0';
  uStack_60 = 0x10e9a9;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,5,&c,1,1);
  if (bVar1 == true) {
    uStack_60 = 0x10e9c3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x284);
    if (local_30 == (char *)0x6) {
      uStack_60 = 0x10e9e3;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x285);
      if (local_28 == (char *)0x8) {
        uStack_60 = 0x10ea03;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x286);
        if (local_20 == (char *)0x0) {
          ppcVar6 = &local_68;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x287;
LAB_0010ecdc:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) = test_ADynArray_insert_success_beyondEndIndex_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
        }
        uStack_60 = 0x10ea20;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x287);
        if ((char *)(long)local_20[5] != (char *)0x0) {
          ppcVar6 = &local_78;
          local_70 = "\'\\0\'";
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar7 = "array.buffer[5] == \'\\0\'";
          pcVar8 = "array.buffer[5]";
          iVar2 = 0x288;
          local_78 = (char *)(long)local_20[5];
          goto LAB_0010ecdc;
        }
        uStack_60 = 0x10ea44;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x288);
        pcStack_90 = local_20;
        if (local_20 == (char *)0x0) {
          pcVar3 = "";
          pcStack_90 = "(null)";
        }
        else {
          uStack_60 = 0x10ea61;
          iVar2 = strcmp("01234",local_20);
          if (iVar2 == 0) {
            uStack_60 = 0x10ea7a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x289);
            if (local_38 == (code *)0x0) {
              ppcVar6 = &local_68;
              pcVar4 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar7 = "(void*) array.growStrategy != NULL";
              pcVar8 = "(void*) array.growStrategy";
              iVar2 = 0x28a;
            }
            else {
              uStack_60 = 0x10ea97;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x28a);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_60 = 0x10eab8;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x28b);
                uStack_60 = 0x10eac1;
                (*pcStack_40)(local_20);
                return;
              }
              ppcVar6 = &local_78;
              local_70 = "0";
              local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x28b;
            }
            goto LAB_0010ecdc;
          }
          pcVar3 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "array.buffer == \"01234\"";
        pcVar7 = "array.buffer";
        iVar2 = 0x289;
        local_68 = "\"";
        local_70 = "01234";
        local_78 = "\"";
        pcStack_80 = "\"01234\"";
        ppcVar5 = &pcStack_90;
        pcStack_88 = pcVar3;
        goto LAB_0010ec5c;
      }
      local_70 = "8";
      pcVar4 = "array.capacity == 8";
      pcVar7 = "array.capacity";
      iVar2 = 0x286;
      local_68 = (char *)0x8;
      pcVar3 = local_28;
    }
    else {
      local_70 = "6";
      pcVar4 = "array.size == 6";
      pcVar7 = "array.size";
      iVar2 = 0x285;
      local_68 = (char *)0x6;
      pcVar3 = local_30;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    local_70 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_insertArray(&array, 5, &(c), 1, sizeof(*(&array)->buffer)) == true";
    pcVar7 = "private_ACUtils_ADynArray_insertArray(&array, 5, &(c), 1, sizeof(*(&array)->buffer))";
    iVar2 = 0x284;
    local_68 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &local_70;
LAB_0010ec5c:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x10ec63;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insert_success_endIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insert(&array, 5, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[5], '\0');
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}